

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSM::output(FSM *this,shared_ptr<kratos::Var> *var,shared_ptr<kratos::Var> *default_)

{
  initializer_list<const_kratos::IRNode_*> __l;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Generator *pGVar4;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar5 [16];
  format_args args;
  string_view format_str;
  element_type *local_140;
  element_type *local_138;
  undefined1 local_12a;
  allocator<const_kratos::IRNode_*> local_129;
  element_type *local_128;
  element_type **local_120;
  size_type local_118;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_110;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_cd;
  string local_c0;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<kratos::Var> *default__local;
  shared_ptr<kratos::Var> *var_local;
  FSM *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a0 = &default_->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  default__local = var;
  var_local = (shared_ptr<kratos::Var> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)var);
  if (!bVar1) {
    local_cd = 1;
    auVar5 = __cxa_allocate_exception(0x10);
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&this->generator_->instance_name;
    local_38 = &local_c0;
    local_40 = "var not found in {0}";
    local_68.named_args.data =
         (named_arg_info<char> *)
         fmt::v7::make_args_checked<std::__cxx11::string&,char[21],char>
                   ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)"var not found in {0}",(v7 *)vargs,auVar5._8_8_,
                    (remove_reference_t<std::__cxx11::basic_string<char>_&> *)"var not found in {0}"
                   );
    local_50 = &local_68;
    local_78 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_78.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_c0,(detail *)local_78.data_,format_str,args);
    UserException::UserException(auVar5._0_8_,&local_c0);
    local_cd = 0;
    __cxa_throw(auVar5._0_8_,&UserException::typeinfo,UserException::~UserException);
  }
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      default__local);
  iVar2 = (*(peVar3->super_IRNode)._vptr_IRNode[4])();
  if ((Generator *)CONCAT44(extraout_var,iVar2) != this->generator_) {
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)default__local);
    iVar2 = (*(peVar3->super_IRNode)._vptr_IRNode[4])();
    pGVar4 = (Generator *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))();
    if (pGVar4 != this->generator_) {
      local_12a = 1;
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"FSM output has to be scoped inside the top-level of generator"
                 ,&local_f1);
      local_128 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                            (&default__local->
                              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      local_120 = &local_128;
      local_118 = 1;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_129);
      __l._M_len = local_118;
      __l._M_array = (iterator)local_120;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_110,__l,&local_129);
      VarException::VarException(this_00,&local_f0,&local_110);
      local_12a = 0;
      __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
    }
  }
  local_138 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                        (&default__local->
                          super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  local_140 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_a0);
  std::
  unordered_map<kratos::Var*,kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
  ::emplace<kratos::Var*,kratos::Var*>
            ((unordered_map<kratos::Var*,kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>
              *)&this->outputs_,&local_138,&local_140);
  return;
}

Assistant:

void FSM::output(const std::shared_ptr<Var>& var, const std::shared_ptr<Var>& default_) {
    if (!var) throw UserException(::format("var not found in {0}", generator_->instance_name));
    // very strict checking of ownership
    if (var->parent() != generator_) {
        if (var->parent()->parent() != generator_)
            throw VarException("FSM output has to be scoped inside the top-level of generator",
                               {var.get()});
    }
    outputs_.emplace(var.get(), default_.get());
}